

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O2

H264_StorePic_t * alloc_storable_picture(H264dVideoCtx_t *p_Vid,RK_S32 structure)

{
  H264_StorePic_t *pHVar1;
  
  pHVar1 = (H264_StorePic_t *)mpp_mem_pool_get_f("alloc_storable_picture",p_Vid->pic_st);
  if (pHVar1 == (H264_StorePic_t *)0x0) {
    if (((byte)h264d_debug & 1) != 0) {
      _mpp_log_l(4,"h264d_dpb","malloc buffer error(%d).\n",(char *)0x0,0x717);
    }
  }
  else {
    pHVar1->view_id = -1;
    pHVar1->structure = structure;
  }
  return pHVar1;
}

Assistant:

H264_StorePic_t *alloc_storable_picture(H264dVideoCtx_t *p_Vid, RK_S32 structure)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264_StorePic_t *s = mpp_mem_pool_get(p_Vid->pic_st);

    MEM_CHECK(ret, s);
    s->view_id = -1;
    s->structure = structure;
    (void)p_Vid;

    return s;
__FAILED:
    (void)ret;
    return NULL;
}